

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOCBparser.c
# Opt level: O1

int docbParseChunk(docbParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  
  if (docbParseChunk_deprecated == '\0') {
    pp_Var3 = __xmlGenericError();
    p_Var1 = *pp_Var3;
    ppvVar4 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar4,"docbParseChunk() deprecated function reached\n");
    docbParseChunk_deprecated = '\x01';
  }
  iVar2 = xmlParseChunk(ctxt,chunk,size,terminate);
  return iVar2;
}

Assistant:

int
docbParseChunk(docbParserCtxtPtr ctxt ATTRIBUTE_UNUSED,
               const char *chunk ATTRIBUTE_UNUSED,
	       int size ATTRIBUTE_UNUSED,
               int terminate ATTRIBUTE_UNUSED)
{
    static int deprecated = 0;

    if (!deprecated) {
        xmlGenericError(xmlGenericErrorContext,
                        "docbParseChunk() deprecated function reached\n");
        deprecated = 1;
    }

    return (xmlParseChunk(ctxt, chunk, size, terminate));
}